

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

string * duckdb::PhysicalCopyToFile::GetNonTmpFile
                   (string *__return_storage_ptr__,ClientContext *context,string *tmp_file_path)

{
  FileSystem *this;
  long lVar1;
  string base;
  string path;
  string local_78;
  string local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  this = FileSystem::GetFileSystem(context);
  StringUtil::GetFilePath(&local_58,tmp_file_path);
  StringUtil::GetFileName(&local_78,tmp_file_path);
  lVar1 = ::std::__cxx11::string::find((char *)&local_78,0x1dc6b6c,0);
  if (lVar1 == 0) {
    ::std::__cxx11::string::substr((ulong)local_38,(ulong)&local_78);
    ::std::__cxx11::string::operator=((string *)&local_78,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  FileSystem::JoinPath(__return_storage_ptr__,this,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string PhysicalCopyToFile::GetNonTmpFile(ClientContext &context, const string &tmp_file_path) {
	auto &fs = FileSystem::GetFileSystem(context);

	auto path = StringUtil::GetFilePath(tmp_file_path);
	auto base = StringUtil::GetFileName(tmp_file_path);

	auto prefix = base.find("tmp_");
	if (prefix == 0) {
		base = base.substr(4);
	}

	return fs.JoinPath(path, base);
}